

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# access.c
# Opt level: O0

void GetFileExtension(ctmbstr path,tmbchar *ext,uint maxExt)

{
  uint uVar1;
  int local_20;
  int i;
  uint maxExt_local;
  tmbchar *ext_local;
  ctmbstr path_local;
  
  uVar1 = prvTidytmbstrlen(path);
  local_20 = uVar1 - 1;
  *ext = '\0';
  do {
    if (path[local_20] == '/') {
      return;
    }
    if (path[local_20] == '\\') {
      return;
    }
    if (path[local_20] == '.') {
      prvTidytmbstrncpy(ext,path + local_20,maxExt);
      return;
    }
    local_20 = local_20 + -1;
  } while (0 < local_20);
  return;
}

Assistant:

static void GetFileExtension( ctmbstr path, tmbchar *ext, uint maxExt )
{
    int i = TY_(tmbstrlen)(path) - 1;
    
    ext[0] = '\0';
    
    do {
        if ( path[i] == '/' || path[i] == '\\' )
            break;
        else if ( path[i] == '.' )
        {
            TY_(tmbstrncpy)( ext, path+i, maxExt );
            break;
        }
    } while ( --i > 0 );
}